

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O0

bool __thiscall
cmWhileCommand::InvokeInitialPass
          (cmWhileCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *param_2)

{
  size_type sVar1;
  cmWhileFunctionBlocker *this_00;
  cmWhileFunctionBlocker *f;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  cmWhileCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this;
  sVar1 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size(args);
  if (sVar1 != 0) {
    this_00 = (cmWhileFunctionBlocker *)operator_new(0x90);
    cmWhileFunctionBlocker::cmWhileFunctionBlocker(this_00,(this->super_cmCommand).Makefile);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator=
              (&this_00->Args,
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)param_2_local);
    cmMakefile::AddFunctionBlocker((this->super_cmCommand).Makefile,(cmFunctionBlocker *)this_00);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return sVar1 != 0;
}

Assistant:

bool cmWhileCommand
::InvokeInitialPass(const std::vector<cmListFileArgument>& args,
                    cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // create a function blocker
  cmWhileFunctionBlocker *f = new cmWhileFunctionBlocker(this->Makefile);
  f->Args = args;
  this->Makefile->AddFunctionBlocker(f);

  return true;
}